

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeSearchPointSwap(RtreeCursor *p,int i,int j)

{
  RtreeDValue RVar1;
  sqlite3_int64 sVar2;
  RtreeNode *pRVar3;
  u8 uVar4;
  u8 uVar5;
  undefined5 uVar6;
  u8 uVar7;
  u8 uVar8;
  u8 uVar9;
  undefined5 uVar10;
  int iVar11;
  int iVar12;
  RtreeSearchPoint *pRVar13;
  RtreeSearchPoint *pRVar14;
  RtreeNode *pTemp;
  RtreeSearchPoint t;
  int j_local;
  int i_local;
  RtreeCursor *p_local;
  
  pRVar13 = p->aPoint + i;
  RVar1 = pRVar13->rScore;
  sVar2 = pRVar13->id;
  uVar7 = pRVar13->iLevel;
  uVar8 = pRVar13->eWithin;
  uVar9 = pRVar13->iCell;
  uVar10 = *(undefined5 *)&pRVar13->field_0x13;
  pRVar13 = p->aPoint + i;
  pRVar14 = p->aPoint + j;
  pRVar13->rScore = pRVar14->rScore;
  pRVar13->id = pRVar14->id;
  uVar4 = pRVar14->eWithin;
  uVar5 = pRVar14->iCell;
  uVar6 = *(undefined5 *)&pRVar14->field_0x13;
  pRVar13->iLevel = pRVar14->iLevel;
  pRVar13->eWithin = uVar4;
  pRVar13->iCell = uVar5;
  *(undefined5 *)&pRVar13->field_0x13 = uVar6;
  pRVar13 = p->aPoint + j;
  pRVar13->rScore = RVar1;
  pRVar13->id = sVar2;
  pRVar13->iLevel = uVar7;
  pRVar13->eWithin = uVar8;
  pRVar13->iCell = uVar9;
  *(undefined5 *)&pRVar13->field_0x13 = uVar10;
  iVar11 = i + 1;
  iVar12 = j + 1;
  if (iVar11 < 5) {
    if (iVar12 < 5) {
      pRVar3 = p->aNode[iVar11];
      p->aNode[iVar11] = p->aNode[iVar12];
      p->aNode[iVar12] = pRVar3;
    }
    else {
      nodeRelease((Rtree *)(p->base).pVtab,p->aNode[iVar11]);
      p->aNode[iVar11] = (RtreeNode *)0x0;
    }
  }
  return;
}

Assistant:

static void rtreeSearchPointSwap(RtreeCursor *p, int i, int j){
  RtreeSearchPoint t = p->aPoint[i];
  assert( i<j );
  p->aPoint[i] = p->aPoint[j];
  p->aPoint[j] = t;
  i++; j++;
  if( i<RTREE_CACHE_SZ ){
    if( j>=RTREE_CACHE_SZ ){
      nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
      p->aNode[i] = 0;
    }else{
      RtreeNode *pTemp = p->aNode[i];
      p->aNode[i] = p->aNode[j];
      p->aNode[j] = pTemp;
    }
  }
}